

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

double interpolate_linear(double *xin,double *yin,int N,double z)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  double *__ptr;
  double *__ptr_00;
  int *pos;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  double dVar8;
  double local_38;
  
  lVar4 = (long)N;
  __ptr = (double *)malloc(lVar4 * 8);
  __ptr_00 = (double *)malloc(lVar4 * 8);
  pos = (int *)malloc(lVar4 * 4);
  sort1d_ascending(xin,N,pos);
  if (0 < N) {
    uVar6 = 0;
    do {
      iVar3 = pos[uVar6];
      __ptr[uVar6] = xin[iVar3];
      __ptr_00[uVar6] = yin[iVar3];
      uVar6 = uVar6 + 1;
    } while ((uint)N != uVar6);
    if (z < *__ptr) {
      local_38 = *__ptr_00;
      goto LAB_0013242f;
    }
  }
  dVar8 = __ptr[lVar4 + -1];
  lVar4 = lVar4 + -1;
  if (z <= dVar8) {
    uVar6 = 0;
    if (2 < N) {
      uVar7 = N - 1;
      do {
        uVar5 = (int)((int)uVar6 + uVar7) / 2;
        if (__ptr[(int)uVar5] <= z) {
          uVar6 = (ulong)uVar5;
          uVar5 = uVar7;
        }
        uVar7 = uVar5;
      } while ((int)uVar6 < (int)(uVar7 - 1));
      lVar4 = (long)(int)uVar7;
      dVar8 = __ptr[lVar4];
      uVar6 = (ulong)(int)uVar6;
    }
    if ((dVar8 != z) || (NAN(dVar8) || NAN(z))) {
      dVar1 = __ptr[uVar6];
      local_38 = __ptr_00[uVar6];
      if ((dVar1 != z) || (NAN(dVar1) || NAN(z))) {
        dVar2 = __ptr_00[lVar4];
        free(__ptr);
        free(__ptr_00);
        free(pos);
        return ((z - dVar1) / (dVar8 - dVar1)) * (dVar2 - local_38) + local_38;
      }
      goto LAB_0013242f;
    }
  }
  local_38 = __ptr_00[lVar4];
LAB_0013242f:
  free(__ptr);
  free(__ptr_00);
  free(pos);
  return local_38;
}

Assistant:

double interpolate_linear(double *xin,double *yin, int N, double z) {
	int i,j,k;
	double *x,*y;
	int *pos;
	double out,ylo,yhi;

	x = (double*)malloc(sizeof(double)*N);
	y = (double*)malloc(sizeof(double)*N);
	pos = (int*)malloc(sizeof(int)*N);

	sort1d_ascending(xin,N,pos);

	for(i = 0; i < N;++i) {
		x[i] = xin[pos[i]];
		y[i] = yin[pos[i]];
	}

	ylo= y[0];
	yhi = y[N-1];

	i = 0;
	j = N - 1;

	if (z < x[0]) {
		free(x);
		free(y);
		free(pos);
		return ylo;
	}

	if (z > x[j]) {
		free(x);
		free(y);
		free(pos);
		return yhi;
	}

	while (i < j-1) {
		k = (i + j)/2;
		if (z < x[k]) {
			j = k;
		} else {
			i = k;
		}
	}

	if (z == x[j]) {
		out = y[j];
		free(x);
		free(y);
		free(pos);
		return out;
	}

	if (z == x[i]) {
		out = y[i];
		free(x);
		free(y);
		free(pos);
		return out;
	}

	out = y[i] + (y[j] - y[i])* ((z - x[i])/(x[j] - x[i]));

	free(x);
	free(y);
	free(pos);

	return out;
}